

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.h
# Opt level: O2

Scope * __thiscall
FactoredDecPOMDPDiscrete::GetAgentScopeForLRF(FactoredDecPOMDPDiscrete *this,Index LRF)

{
  const_reference pvVar1;
  
  pvVar1 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agScopes,(ulong)LRF);
  return pvVar1;
}

Assistant:

const Scope& GetAgentScopeForLRF(Index LRF) const
    {return _m_agScopes.at(LRF); }